

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask9_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar1 = in[1] << 9 | uVar1;
  *out = uVar1;
  uVar1 = in[2] << 0x12 | uVar1;
  *out = uVar1;
  uVar2 = in[3];
  *out = uVar2 << 0x1b | uVar1;
  uVar2 = uVar2 >> 5;
  out[1] = uVar2;
  uVar2 = in[4] << 4 | uVar2;
  out[1] = uVar2;
  uVar2 = in[5] << 0xd | uVar2;
  out[1] = uVar2;
  uVar2 = in[6] << 0x16 | uVar2;
  out[1] = uVar2;
  uVar1 = in[7];
  out[1] = uVar1 << 0x1f | uVar2;
  uVar1 = uVar1 >> 1;
  out[2] = uVar1;
  uVar1 = in[8] << 8 | uVar1;
  out[2] = uVar1;
  uVar1 = in[9] << 0x11 | uVar1;
  out[2] = uVar1;
  uVar2 = in[10];
  out[2] = uVar2 << 0x1a | uVar1;
  uVar2 = uVar2 >> 6;
  out[3] = uVar2;
  uVar2 = in[0xb] << 3 | uVar2;
  out[3] = uVar2;
  uVar2 = in[0xc] << 0xc | uVar2;
  out[3] = uVar2;
  uVar2 = in[0xd] << 0x15 | uVar2;
  out[3] = uVar2;
  uVar1 = in[0xe];
  out[3] = uVar1 << 0x1e | uVar2;
  uVar1 = uVar1 >> 2;
  out[4] = uVar1;
  out[4] = in[0xf] << 7 | uVar1;
  return out + 5;
}

Assistant:

uint32_t *__fastpackwithoutmask9_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (9 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (9 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (9 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (9 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;

  return out + 1;
}